

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxout.cpp
# Opt level: O3

void __thiscall ConfidentialTxOut_Setter_Test::TestBody(ConfidentialTxOut_Setter_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ConfidentialAssetId *object;
  ConfidentialValue *object_00;
  ConfidentialNonce *object_01;
  undefined8 uVar2;
  undefined1 auVar3 [8];
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  AssertHelperData *pAVar6;
  pointer pcVar7;
  char *pcVar8;
  size_t sVar9;
  ulong uVar10;
  Amount AVar11;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_29;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_23;
  ConfidentialTxOutReference txout_ref;
  ConfidentialTxOut txout;
  undefined1 local_2b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  undefined1 local_298 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288 [3];
  string local_258;
  int local_230 [2];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_228;
  undefined1 local_220 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_218;
  undefined1 local_210 [64];
  ConfidentialAssetId local_1d0;
  ConfidentialValue local_1a8;
  ConfidentialNonce local_180;
  pointer local_158;
  pointer local_150;
  pointer local_140;
  pointer local_138;
  ConfidentialTxOut local_128;
  
  cfd::core::ConfidentialTxOut::ConfidentialTxOut(&local_128);
  object = &local_128.asset_;
  cfd::core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)local_220,object);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
            ((string *)local_298,(ConfidentialAssetId *)local_220);
  pcVar8 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2b8,"txout.GetAsset().GetHex().c_str()","\"\"",(char *)local_298,"");
  if (local_298 != (undefined1  [8])local_288) {
    operator_delete((void *)local_298);
  }
  local_220 = (undefined1  [8])&PTR__ConfidentialAssetId_0068d228;
  if ((void *)CONCAT71(local_218.ptr_._1_7_,local_218.ptr_._0_1_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_218.ptr_._1_7_,local_218.ptr_._0_1_));
  }
  if (local_2b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_220);
    if ((pointer)local_2b8._8_8_ != (pointer)0x0) {
      pcVar8 = *(char **)local_2b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xc9,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_298,(Message *)local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_298);
    if (local_220 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_220 != (undefined1  [8])0x0)) {
        (**(code **)(*(_func_int **)local_220 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_2b8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  object_00 = &local_128.confidential_value_;
  cfd::core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)local_220,object_00);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_
            ((string *)local_298,(ConfidentialValue *)local_220);
  pcVar8 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2b8,"txout.GetConfidentialValue().GetHex().c_str()","\"\"",
             (char *)local_298,"");
  if (local_298 != (undefined1  [8])local_288) {
    operator_delete((void *)local_298);
  }
  local_220 = (undefined1  [8])&PTR__ConfidentialValue_0068d0c0;
  if ((void *)CONCAT71(local_218.ptr_._1_7_,local_218.ptr_._0_1_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_218.ptr_._1_7_,local_218.ptr_._0_1_));
  }
  if (local_2b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_220);
    if ((pointer)local_2b8._8_8_ != (pointer)0x0) {
      pcVar8 = *(char **)local_2b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xca,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_298,(Message *)local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_298);
    if (local_220 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_220 != (undefined1  [8])0x0)) {
        (**(code **)(*(_func_int **)local_220 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_2b8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::AbstractTxOut::GetLockingScript((Script *)local_220,&local_128.super_AbstractTxOut);
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_298,(Script *)local_220);
  pcVar8 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2b8,"txout.GetLockingScript().GetHex().c_str()","\"\"",
             (char *)local_298,"");
  if (local_298 != (undefined1  [8])local_288) {
    operator_delete((void *)local_298);
  }
  cfd::core::Script::~Script((Script *)local_220);
  if (local_2b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_220);
    if ((pointer)local_2b8._8_8_ != (pointer)0x0) {
      pcVar8 = *(char **)local_2b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xcb,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_298,(Message *)local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_298);
    if (local_220 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_220 != (undefined1  [8])0x0)) {
        (**(code **)(*(_func_int **)local_220 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_2b8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  object_01 = &local_128.nonce_;
  cfd::core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)local_220,object_01);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_
            ((string *)local_298,(ConfidentialNonce *)local_220);
  pcVar8 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2b8,"txout.GetNonce().GetHex().c_str()","\"\"",(char *)local_298,"");
  if (local_298 != (undefined1  [8])local_288) {
    operator_delete((void *)local_298);
  }
  local_220 = (undefined1  [8])&PTR__ConfidentialNonce_0068d410;
  if ((void *)CONCAT71(local_218.ptr_._1_7_,local_218.ptr_._0_1_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_218.ptr_._1_7_,local_218.ptr_._0_1_));
  }
  if (local_2b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_220);
    if ((pointer)local_2b8._8_8_ != (pointer)0x0) {
      pcVar8 = *(char **)local_2b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xcc,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_298,(Message *)local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_298);
    if (local_220 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_220 != (undefined1  [8])0x0)) {
        (**(code **)(*(_func_int **)local_220 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_2b8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_298 = (undefined1  [8])0x0;
  sStack_290.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_288[0]._M_allocated_capacity = 0;
  uVar10 = (long)local_128.range_proof_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_128.range_proof_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (uVar10 == 0) {
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    sVar9 = 0;
  }
  else {
    if ((long)uVar10 < 0) {
      std::__throw_bad_alloc();
    }
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             operator_new(uVar10);
    sVar9 = (long)local_128.range_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_128.range_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_288[0]._0_8_ = uVar10 + (long)pbVar5;
  local_298 = (undefined1  [8])pbVar5;
  if (local_128.range_proof_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_128.range_proof_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    sStack_290.ptr_ = pbVar5;
    memmove(pbVar5,local_128.range_proof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar9);
  }
  sStack_290.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&(pbVar5->_M_dataplus)._M_p + sVar9);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_220,(ByteData *)local_298);
  pcVar8 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2b8,"txout.GetRangeProof().GetHex().c_str()","\"\"",(char *)local_220
             ,"");
  if (local_220 != (undefined1  [8])local_210) {
    operator_delete((void *)local_220);
  }
  if (local_298 != (undefined1  [8])0x0) {
    operator_delete((void *)local_298);
  }
  if (local_2b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_220);
    if ((pointer)local_2b8._8_8_ != (pointer)0x0) {
      pcVar8 = *(char **)local_2b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xcd,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_298,(Message *)local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_298);
    if (local_220 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_220 != (undefined1  [8])0x0)) {
        (**(code **)(*(_func_int **)local_220 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_2b8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_298 = (undefined1  [8])0x0;
  sStack_290.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_288[0]._M_allocated_capacity = 0;
  uVar10 = (long)local_128.surjection_proof_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_128.surjection_proof_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (uVar10 == 0) {
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    sVar9 = 0;
  }
  else {
    if ((long)uVar10 < 0) {
      std::__throw_bad_alloc();
    }
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             operator_new(uVar10);
    sVar9 = (long)local_128.surjection_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_128.surjection_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_288[0]._0_8_ = uVar10 + (long)pbVar5;
  local_298 = (undefined1  [8])pbVar5;
  if (local_128.surjection_proof_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_128.surjection_proof_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sStack_290.ptr_ = pbVar5;
    memmove(pbVar5,local_128.surjection_proof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar9);
  }
  sStack_290.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&(pbVar5->_M_dataplus)._M_p + sVar9);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_220,(ByteData *)local_298);
  pcVar8 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2b8,"txout.GetSurjectionProof().GetHex().c_str()","\"\"",
             (char *)local_220,"");
  if (local_220 != (undefined1  [8])local_210) {
    operator_delete((void *)local_220);
  }
  if (local_298 != (undefined1  [8])0x0) {
    operator_delete((void *)local_298);
  }
  if (local_2b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_220);
    if ((pointer)local_2b8._8_8_ != (pointer)0x0) {
      pcVar8 = *(char **)local_2b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xce,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_298,(Message *)local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_298);
    if (local_220 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_220 != (undefined1  [8])0x0)) {
        (**(code **)(*(_func_int **)local_220 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_2b8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  AVar11 = cfd::core::AbstractTxOut::GetValue(&local_128.super_AbstractTxOut);
  local_298 = (undefined1  [8])AVar11.amount_;
  sStack_290.ptr_._0_1_ = AVar11.ignore_check_;
  local_2b8._0_8_ = cfd::core::Amount::GetSatoshiValue((Amount *)local_298);
  local_258._M_dataplus._M_p = (pointer)((ulong)local_258._M_dataplus._M_p._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_220,"txout.GetValue().GetSatoshiValue()","0",(long *)local_2b8,
             (int *)&local_258);
  if (local_220[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_298);
    if ((undefined8 *)CONCAT71(local_218.ptr_._1_7_,local_218.ptr_._0_1_) == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)CONCAT71(local_218.ptr_._1_7_,local_218.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xcf,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2b8,(Message *)local_298);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2b8);
    if (local_298 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_298 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_298 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_218,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialTxOut::GetWitnessHash((ByteData256 *)local_298,&local_128);
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)local_220,(ByteData256 *)local_298);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2b8,"txout.GetWitnessHash().GetHex().c_str()",
             "\"7d993a3ac51b76589a07c59078e2e4241f4c13c5190a763f22213e0c9ed8e7d5\"",
             (char *)local_220,"7d993a3ac51b76589a07c59078e2e4241f4c13c5190a763f22213e0c9ed8e7d5");
  if (local_220 != (undefined1  [8])local_210) {
    operator_delete((void *)local_220);
  }
  if (local_298 != (undefined1  [8])0x0) {
    operator_delete((void *)local_298);
  }
  if (local_2b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_220);
    if ((pointer)local_2b8._8_8_ == (pointer)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_2b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xd1,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_298,(Message *)local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_298);
    if (local_220 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_220 != (undefined1  [8])0x0)) {
        (**(code **)(*(_func_int **)local_220 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_2b8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  AVar11 = cfd::core::Amount::CreateBySatoshiAmount(100000000);
  local_220 = (undefined1  [8])AVar11.amount_;
  local_218.ptr_._0_1_ = AVar11.ignore_check_;
  cfd::core::ConfidentialTxOut::SetValue(&local_128,(Amount *)local_220);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)local_220,object);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
            ((string *)local_298,(ConfidentialAssetId *)local_220);
  pcVar8 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2b8,"txout.GetAsset().GetHex().c_str()","\"\"",(char *)local_298,"");
  if (local_298 != (undefined1  [8])local_288) {
    operator_delete((void *)local_298);
  }
  local_220 = (undefined1  [8])&PTR__ConfidentialAssetId_0068d228;
  if ((void *)CONCAT71(local_218.ptr_._1_7_,local_218.ptr_._0_1_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_218.ptr_._1_7_,local_218.ptr_._0_1_));
  }
  if (local_2b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_220);
    if ((pointer)local_2b8._8_8_ != (pointer)0x0) {
      pcVar8 = *(char **)local_2b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xd5,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_298,(Message *)local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_298);
    if (local_220 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_220 != (undefined1  [8])0x0)) {
        (**(code **)(*(_func_int **)local_220 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_2b8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)local_220,object_00);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_
            ((string *)local_298,(ConfidentialValue *)local_220);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2b8,"txout.GetConfidentialValue().GetHex().c_str()",
             "\"010000000005f5e100\"",(char *)local_298,"010000000005f5e100");
  if (local_298 != (undefined1  [8])local_288) {
    operator_delete((void *)local_298);
  }
  local_220 = (undefined1  [8])&PTR__ConfidentialValue_0068d0c0;
  if ((void *)CONCAT71(local_218.ptr_._1_7_,local_218.ptr_._0_1_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_218.ptr_._1_7_,local_218.ptr_._0_1_));
  }
  if (local_2b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_220);
    if ((pointer)local_2b8._8_8_ == (pointer)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_2b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xd7,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_298,(Message *)local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_298);
    if (local_220 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_220 != (undefined1  [8])0x0)) {
        (**(code **)(*(_func_int **)local_220 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_2b8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::AbstractTxOut::GetLockingScript((Script *)local_220,&local_128.super_AbstractTxOut);
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_298,(Script *)local_220);
  pcVar8 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2b8,"txout.GetLockingScript().GetHex().c_str()","\"\"",
             (char *)local_298,"");
  if (local_298 != (undefined1  [8])local_288) {
    operator_delete((void *)local_298);
  }
  cfd::core::Script::~Script((Script *)local_220);
  if (local_2b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_220);
    if ((pointer)local_2b8._8_8_ != (pointer)0x0) {
      pcVar8 = *(char **)local_2b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xd8,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_298,(Message *)local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_298);
    if (local_220 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_220 != (undefined1  [8])0x0)) {
        (**(code **)(*(_func_int **)local_220 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_2b8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)local_220,object_01);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_
            ((string *)local_298,(ConfidentialNonce *)local_220);
  pcVar8 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2b8,"txout.GetNonce().GetHex().c_str()","\"\"",(char *)local_298,"");
  if (local_298 != (undefined1  [8])local_288) {
    operator_delete((void *)local_298);
  }
  local_220 = (undefined1  [8])&PTR__ConfidentialNonce_0068d410;
  if ((void *)CONCAT71(local_218.ptr_._1_7_,local_218.ptr_._0_1_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_218.ptr_._1_7_,local_218.ptr_._0_1_));
  }
  if (local_2b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_220);
    if ((pointer)local_2b8._8_8_ != (pointer)0x0) {
      pcVar8 = *(char **)local_2b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xd9,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_298,(Message *)local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_298);
    if (local_220 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_220 != (undefined1  [8])0x0)) {
        (**(code **)(*(_func_int **)local_220 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_2b8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_298 = (undefined1  [8])0x0;
  sStack_290.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_288[0]._M_allocated_capacity = 0;
  uVar10 = (long)local_128.range_proof_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_128.range_proof_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (uVar10 == 0) {
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    sVar9 = 0;
  }
  else {
    if ((long)uVar10 < 0) {
      std::__throw_bad_alloc();
    }
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             operator_new(uVar10);
    sVar9 = (long)local_128.range_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_128.range_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_288[0]._0_8_ = uVar10 + (long)pbVar5;
  local_298 = (undefined1  [8])pbVar5;
  if (local_128.range_proof_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_128.range_proof_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    sStack_290.ptr_ = pbVar5;
    memmove(pbVar5,local_128.range_proof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar9);
  }
  sStack_290.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&(pbVar5->_M_dataplus)._M_p + sVar9);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_220,(ByteData *)local_298);
  pcVar8 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2b8,"txout.GetRangeProof().GetHex().c_str()","\"\"",(char *)local_220
             ,"");
  if (local_220 != (undefined1  [8])local_210) {
    operator_delete((void *)local_220);
  }
  if (local_298 != (undefined1  [8])0x0) {
    operator_delete((void *)local_298);
  }
  if (local_2b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_220);
    if ((pointer)local_2b8._8_8_ != (pointer)0x0) {
      pcVar8 = *(char **)local_2b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xda,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_298,(Message *)local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_298);
    if (local_220 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_220 != (undefined1  [8])0x0)) {
        (**(code **)(*(_func_int **)local_220 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_2b8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_298 = (undefined1  [8])0x0;
  sStack_290.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_288[0]._M_allocated_capacity = 0;
  uVar10 = (long)local_128.surjection_proof_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_128.surjection_proof_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (uVar10 == 0) {
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    sVar9 = 0;
  }
  else {
    if ((long)uVar10 < 0) {
      std::__throw_bad_alloc();
    }
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             operator_new(uVar10);
    sVar9 = (long)local_128.surjection_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_128.surjection_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_288[0]._0_8_ = uVar10 + (long)pbVar5;
  local_298 = (undefined1  [8])pbVar5;
  if (local_128.surjection_proof_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_128.surjection_proof_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sStack_290.ptr_ = pbVar5;
    memmove(pbVar5,local_128.surjection_proof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar9);
  }
  sStack_290.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&(pbVar5->_M_dataplus)._M_p + sVar9);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_220,(ByteData *)local_298);
  pcVar8 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2b8,"txout.GetSurjectionProof().GetHex().c_str()","\"\"",
             (char *)local_220,"");
  if (local_220 != (undefined1  [8])local_210) {
    operator_delete((void *)local_220);
  }
  if (local_298 != (undefined1  [8])0x0) {
    operator_delete((void *)local_298);
  }
  if (local_2b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_220);
    if ((pointer)local_2b8._8_8_ != (pointer)0x0) {
      pcVar8 = *(char **)local_2b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xdb,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_298,(Message *)local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_298);
    if (local_220 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_220 != (undefined1  [8])0x0)) {
        (**(code **)(*(_func_int **)local_220 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_2b8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  AVar11 = cfd::core::AbstractTxOut::GetValue(&local_128.super_AbstractTxOut);
  local_298 = (undefined1  [8])AVar11.amount_;
  sStack_290.ptr_._0_1_ = AVar11.ignore_check_;
  local_2b8._0_8_ = cfd::core::Amount::GetSatoshiValue((Amount *)local_298);
  local_258._M_dataplus._M_p._0_4_ = 100000000;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_220,"txout.GetValue().GetSatoshiValue()","100000000",
             (long *)local_2b8,(int *)&local_258);
  if (local_220[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_298);
    if ((undefined8 *)CONCAT71(local_218.ptr_._1_7_,local_218.ptr_._0_1_) == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)CONCAT71(local_218.ptr_._1_7_,local_218.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xdc,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2b8,(Message *)local_298);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2b8);
    if (local_298 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_298 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_298 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_218,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialTxOut::SetCommitment
            (&local_128,&exp_asset,&exp_value,&exp_nonce,&exp_surjection_proof,&exp_range_proof);
  cfd::core::ConfidentialTxOut::GetWitnessHash((ByteData256 *)local_298,&local_128);
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)local_220,(ByteData256 *)local_298);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2b8,"txout.GetWitnessHash().GetHex().c_str()",
             "\"51e1922fa92165e1705155a1973d9c3b78cbc253ec185f58a4d53a59b3eee093\"",
             (char *)local_220,"51e1922fa92165e1705155a1973d9c3b78cbc253ec185f58a4d53a59b3eee093");
  if (local_220 != (undefined1  [8])local_210) {
    operator_delete((void *)local_220);
  }
  if (local_298 != (undefined1  [8])0x0) {
    operator_delete((void *)local_298);
  }
  if (local_2b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_220);
    if ((pointer)local_2b8._8_8_ == (pointer)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_2b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xe1,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_298,(Message *)local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_298);
    if (local_220 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_220 != (undefined1  [8])0x0)) {
        (**(code **)(*(_func_int **)local_220 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_2b8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)local_220,object);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
            ((string *)local_298,(ConfidentialAssetId *)local_220);
  auVar3 = local_298;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_2b8,&exp_asset);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_258,"txout.GetAsset().GetHex().c_str()","exp_asset.GetHex().c_str()"
             ,(char *)auVar3,(char *)local_2b8._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._0_8_ != &local_2a8) {
    operator_delete((void *)local_2b8._0_8_);
  }
  if (local_298 != (undefined1  [8])local_288) {
    operator_delete((void *)local_298);
  }
  local_220 = (undefined1  [8])&PTR__ConfidentialAssetId_0068d228;
  if ((void *)CONCAT71(local_218.ptr_._1_7_,local_218.ptr_._0_1_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_218.ptr_._1_7_,local_218.ptr_._0_1_));
  }
  if ((char)local_258._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_220);
    if ((undefined8 *)local_258._M_string_length == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_258._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xe3,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_298,(Message *)local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_298);
    if (local_220 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_220 != (undefined1  [8])0x0)) {
        (**(code **)(*(_func_int **)local_220 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_258._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)local_220,object_00);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_
            ((string *)local_298,(ConfidentialValue *)local_220);
  auVar3 = local_298;
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_((string *)local_2b8,&exp_value);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_258,"txout.GetConfidentialValue().GetHex().c_str()",
             "exp_value.GetHex().c_str()",(char *)auVar3,(char *)local_2b8._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._0_8_ != &local_2a8) {
    operator_delete((void *)local_2b8._0_8_);
  }
  if (local_298 != (undefined1  [8])local_288) {
    operator_delete((void *)local_298);
  }
  local_220 = (undefined1  [8])&PTR__ConfidentialValue_0068d0c0;
  if ((void *)CONCAT71(local_218.ptr_._1_7_,local_218.ptr_._0_1_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_218.ptr_._1_7_,local_218.ptr_._0_1_));
  }
  if ((char)local_258._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_220);
    if ((undefined8 *)local_258._M_string_length == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_258._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xe5,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_298,(Message *)local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_298);
    if (local_220 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_220 != (undefined1  [8])0x0)) {
        (**(code **)(*(_func_int **)local_220 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_258._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTxOut::GetLockingScript((Script *)local_220,&local_128.super_AbstractTxOut);
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_298,(Script *)local_220);
  pcVar8 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2b8,"txout.GetLockingScript().GetHex().c_str()","\"\"",
             (char *)local_298,"");
  if (local_298 != (undefined1  [8])local_288) {
    operator_delete((void *)local_298);
  }
  cfd::core::Script::~Script((Script *)local_220);
  if (local_2b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_220);
    if ((pointer)local_2b8._8_8_ != (pointer)0x0) {
      pcVar8 = *(char **)local_2b8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xe6,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_298,(Message *)local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_298);
    if (local_220 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_220 != (undefined1  [8])0x0)) {
        (**(code **)(*(_func_int **)local_220 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_2b8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)local_220,object_01);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_
            ((string *)local_298,(ConfidentialNonce *)local_220);
  auVar3 = local_298;
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_((string *)local_2b8,&exp_nonce);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_258,"txout.GetNonce().GetHex().c_str()","exp_nonce.GetHex().c_str()"
             ,(char *)auVar3,(char *)local_2b8._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._0_8_ != &local_2a8) {
    operator_delete((void *)local_2b8._0_8_);
  }
  if (local_298 != (undefined1  [8])local_288) {
    operator_delete((void *)local_298);
  }
  local_220 = (undefined1  [8])&PTR__ConfidentialNonce_0068d410;
  if ((void *)CONCAT71(local_218.ptr_._1_7_,local_218.ptr_._0_1_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_218.ptr_._1_7_,local_218.ptr_._0_1_));
  }
  if ((char)local_258._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_220);
    if ((undefined8 *)local_258._M_string_length == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_258._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xe7,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_298,(Message *)local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_298);
    if (local_220 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_220 != (undefined1  [8])0x0)) {
        (**(code **)(*(_func_int **)local_220 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_258._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2b8._0_8_ = (AssertHelperData *)0x0;
  local_2b8._8_8_ = (pointer)0x0;
  local_2a8._M_allocated_capacity = 0;
  uVar10 = (long)local_128.range_proof_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_128.range_proof_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (uVar10 == 0) {
    pAVar6 = (AssertHelperData *)0x0;
    sVar9 = 0;
  }
  else {
    if ((long)uVar10 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar6 = (AssertHelperData *)operator_new(uVar10);
    sVar9 = (long)local_128.range_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_128.range_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_2a8._M_allocated_capacity = uVar10 + (long)pAVar6;
  local_2b8._0_8_ = pAVar6;
  if (local_128.range_proof_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_128.range_proof_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_2b8._8_8_ = pAVar6;
    memmove(pAVar6,local_128.range_proof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar9);
  }
  local_2b8._8_8_ = (long)&pAVar6->type + sVar9;
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_220,(ByteData *)local_2b8);
  auVar3 = local_220;
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_298,&exp_range_proof);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_258,"txout.GetRangeProof().GetHex().c_str()",
             "exp_range_proof.GetHex().c_str()",(char *)auVar3,(char *)local_298);
  if (local_298 != (undefined1  [8])local_288) {
    operator_delete((void *)local_298);
  }
  if (local_220 != (undefined1  [8])local_210) {
    operator_delete((void *)local_220);
  }
  if ((AssertHelperData *)local_2b8._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_2b8._0_8_);
  }
  if ((char)local_258._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_220);
    if ((undefined8 *)local_258._M_string_length == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_258._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xe9,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_298,(Message *)local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_298);
    if (local_220 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_220 != (undefined1  [8])0x0)) {
        (**(code **)(*(_func_int **)local_220 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_258._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2b8._0_8_ = (AssertHelperData *)0x0;
  local_2b8._8_8_ = (pointer)0x0;
  local_2a8._M_allocated_capacity = 0;
  uVar10 = (long)local_128.surjection_proof_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_128.surjection_proof_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (uVar10 == 0) {
    pAVar6 = (AssertHelperData *)0x0;
    sVar9 = 0;
  }
  else {
    if ((long)uVar10 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar6 = (AssertHelperData *)operator_new(uVar10);
    sVar9 = (long)local_128.surjection_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_128.surjection_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_2a8._M_allocated_capacity = uVar10 + (long)pAVar6;
  local_2b8._0_8_ = pAVar6;
  if (local_128.surjection_proof_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_128.surjection_proof_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_2b8._8_8_ = pAVar6;
    memmove(pAVar6,local_128.surjection_proof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar9);
  }
  local_2b8._8_8_ = (long)&pAVar6->type + sVar9;
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_220,(ByteData *)local_2b8);
  auVar3 = local_220;
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_298,&exp_surjection_proof);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_258,"txout.GetSurjectionProof().GetHex().c_str()",
             "exp_surjection_proof.GetHex().c_str()",(char *)auVar3,(char *)local_298);
  if (local_298 != (undefined1  [8])local_288) {
    operator_delete((void *)local_298);
  }
  if (local_220 != (undefined1  [8])local_210) {
    operator_delete((void *)local_220);
  }
  if ((AssertHelperData *)local_2b8._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_2b8._0_8_);
  }
  if ((char)local_258._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_220);
    if ((undefined8 *)local_258._M_string_length == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_258._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xeb,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_298,(Message *)local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_298);
    if (local_220 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_220 != (undefined1  [8])0x0)) {
        (**(code **)(*(_func_int **)local_220 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_258._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  AVar11 = cfd::core::AbstractTxOut::GetValue(&local_128.super_AbstractTxOut);
  local_298 = (undefined1  [8])AVar11.amount_;
  sStack_290.ptr_._0_1_ = AVar11.ignore_check_;
  local_2b8._0_8_ = cfd::core::Amount::GetSatoshiValue((Amount *)local_298);
  local_258._M_dataplus._M_p._0_4_ = 100000000;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_220,"txout.GetValue().GetSatoshiValue()","100000000",
             (long *)local_2b8,(int *)&local_258);
  if (local_220[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_298);
    if ((undefined8 *)CONCAT71(local_218.ptr_._1_7_,local_218.ptr_._0_1_) == (undefined8 *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)CONCAT71(local_218.ptr_._1_7_,local_218.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xec,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2b8,(Message *)local_298);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2b8);
    if (local_298 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_298 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_298 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_218,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialTxOutReference::ConfidentialTxOutReference
            ((ConfidentialTxOutReference *)local_220,&local_128);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)local_298,&local_1d0);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
            ((string *)local_2b8,(ConfidentialAssetId *)local_298);
  uVar2 = local_2b8._0_8_;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_258,&exp_asset);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_230,"txout_ref.GetAsset().GetHex().c_str()",
             "exp_asset.GetHex().c_str()",(char *)uVar2,local_258._M_dataplus._M_p);
  paVar1 = &local_258.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar1) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._0_8_ != &local_2a8) {
    operator_delete((void *)local_2b8._0_8_);
  }
  local_298 = (undefined1  [8])&PTR__ConfidentialAssetId_0068d228;
  if (sStack_290.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(sStack_290.ptr_);
  }
  if (local_230[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_298);
    if (local_228.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_228.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xf0,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2b8,(Message *)local_298);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2b8);
    if (local_298 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_298 != (undefined1  [8])0x0)) {
        (**(code **)(*(undefined **)local_298 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_228,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)local_298,&local_1a8);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_
            ((string *)local_2b8,(ConfidentialValue *)local_298);
  uVar2 = local_2b8._0_8_;
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_(&local_258,&exp_value);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_230,"txout_ref.GetConfidentialValue().GetHex().c_str()",
             "exp_value.GetHex().c_str()",(char *)uVar2,local_258._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar1) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._0_8_ != &local_2a8) {
    operator_delete((void *)local_2b8._0_8_);
  }
  local_298 = (undefined1  [8])&PTR__ConfidentialValue_0068d0c0;
  if (sStack_290.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(sStack_290.ptr_);
  }
  if (local_230[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_298);
    if (local_228.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_228.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xf2,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2b8,(Message *)local_298);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2b8);
    if (local_298 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_298 != (undefined1  [8])0x0)) {
        (**(code **)(*(undefined **)local_298 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_228,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Script::Script((Script *)local_298,(Script *)(local_210 + 8));
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_2b8,(Script *)local_298);
  pcVar8 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_258,"txout_ref.GetLockingScript().GetHex().c_str()","\"\"",
             (char *)local_2b8._0_8_,"");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._0_8_ != &local_2a8) {
    operator_delete((void *)local_2b8._0_8_);
  }
  cfd::core::Script::~Script((Script *)local_298);
  if ((char)local_258._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_298);
    if ((undefined8 *)local_258._M_string_length != (undefined8 *)0x0) {
      pcVar8 = *(char **)local_258._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xf3,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2b8,(Message *)local_298);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2b8);
    if (local_298 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_298 != (undefined1  [8])0x0)) {
        (**(code **)(*(undefined **)local_298 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_258._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)local_298,&local_180);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_
            ((string *)local_2b8,(ConfidentialNonce *)local_298);
  uVar2 = local_2b8._0_8_;
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_(&local_258,&exp_nonce);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_230,"txout_ref.GetNonce().GetHex().c_str()",
             "exp_nonce.GetHex().c_str()",(char *)uVar2,local_258._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar1) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._0_8_ != &local_2a8) {
    operator_delete((void *)local_2b8._0_8_);
  }
  local_298 = (undefined1  [8])&PTR__ConfidentialNonce_0068d410;
  if (sStack_290.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(sStack_290.ptr_);
  }
  if (local_230[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_298);
    if (local_228.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_228.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xf5,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2b8,(Message *)local_298);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2b8);
    if (local_298 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_298 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_298 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_228,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_258._M_dataplus._M_p = (pointer)0x0;
  local_258._M_string_length = 0;
  local_258.field_2._M_allocated_capacity = 0;
  uVar10 = (long)local_138 - (long)local_140;
  if (uVar10 == 0) {
    pcVar7 = (pointer)0x0;
    sVar9 = 0;
  }
  else {
    if ((long)uVar10 < 0) {
      std::__throw_bad_alloc();
    }
    pcVar7 = (pointer)operator_new(uVar10);
    sVar9 = (long)local_138 - (long)local_140;
  }
  local_258.field_2._M_allocated_capacity = (size_type)(pcVar7 + uVar10);
  local_258._M_dataplus._M_p = pcVar7;
  if (local_138 != local_140) {
    local_258._M_string_length = (size_type)pcVar7;
    memmove(pcVar7,local_140,sVar9);
  }
  local_258._M_string_length = (size_type)(pcVar7 + sVar9);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_298,(ByteData *)&local_258);
  auVar3 = local_298;
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_2b8,&exp_range_proof);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_230,"txout_ref.GetRangeProof().GetHex().c_str()",
             "exp_range_proof.GetHex().c_str()",(char *)auVar3,(char *)local_2b8._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._0_8_ != &local_2a8) {
    operator_delete((void *)local_2b8._0_8_);
  }
  if (local_298 != (undefined1  [8])local_288) {
    operator_delete((void *)local_298);
  }
  if (local_258._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  if (local_230[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_298);
    if (local_228.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_228.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xf7,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2b8,(Message *)local_298);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2b8);
    if (local_298 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_298 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_298 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_228,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_258._M_dataplus._M_p = (pointer)0x0;
  local_258._M_string_length = 0;
  local_258.field_2._M_allocated_capacity = 0;
  uVar10 = (long)local_150 - (long)local_158;
  if (uVar10 == 0) {
    pcVar7 = (pointer)0x0;
    sVar9 = 0;
  }
  else {
    if ((long)uVar10 < 0) {
      std::__throw_bad_alloc();
    }
    pcVar7 = (pointer)operator_new(uVar10);
    sVar9 = (long)local_150 - (long)local_158;
  }
  local_258.field_2._M_allocated_capacity = (size_type)(pcVar7 + uVar10);
  local_258._M_dataplus._M_p = pcVar7;
  if (local_150 != local_158) {
    local_258._M_string_length = (size_type)pcVar7;
    memmove(pcVar7,local_158,sVar9);
  }
  local_258._M_string_length = (size_type)(pcVar7 + sVar9);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_298,(ByteData *)&local_258);
  auVar3 = local_298;
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_2b8,&exp_surjection_proof);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_230,"txout_ref.GetSurjectionProof().GetHex().c_str()",
             "exp_surjection_proof.GetHex().c_str()",(char *)auVar3,(char *)local_2b8._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._0_8_ != &local_2a8) {
    operator_delete((void *)local_2b8._0_8_);
  }
  if (local_298 != (undefined1  [8])local_288) {
    operator_delete((void *)local_298);
  }
  if (local_258._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  if (local_230[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_298);
    if (local_228.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_228.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xf9,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2b8,(Message *)local_298);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2b8);
    if (local_298 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_298 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_298 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_228,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2b8._0_8_ = CONCAT71(local_218.ptr_._1_7_,local_218.ptr_._0_1_);
  local_2b8[8] = local_210[0];
  local_258._M_dataplus._M_p = (pointer)cfd::core::Amount::GetSatoshiValue((Amount *)local_2b8);
  local_230[0] = 100000000;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_298,"txout_ref.GetValue().GetSatoshiValue()","100000000",
             (long *)&local_258,local_230);
  if (local_298[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2b8);
    if (sStack_290.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((sStack_290.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xfa,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if ((AssertHelperData *)local_2b8._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_2b8._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_2b8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_290,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference
            ((ConfidentialTxOutReference *)local_220);
  cfd::core::ConfidentialTxOut::~ConfidentialTxOut(&local_128);
  return;
}

Assistant:

TEST(ConfidentialTxOut, Setter) {
  ConfidentialTxOut txout;

  EXPECT_STREQ(txout.GetAsset().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetConfidentialValue().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetLockingScript().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetNonce().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetRangeProof().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetSurjectionProof().GetHex().c_str(), "");
  EXPECT_EQ(txout.GetValue().GetSatoshiValue(), 0);
  EXPECT_STREQ(txout.GetWitnessHash().GetHex().c_str(),
    "7d993a3ac51b76589a07c59078e2e4241f4c13c5190a763f22213e0c9ed8e7d5");

  txout.SetValue(Amount::CreateBySatoshiAmount(100000000));

  EXPECT_STREQ(txout.GetAsset().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetConfidentialValue().GetHex().c_str(),
      "010000000005f5e100");
  EXPECT_STREQ(txout.GetLockingScript().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetNonce().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetRangeProof().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetSurjectionProof().GetHex().c_str(), "");
  EXPECT_EQ(txout.GetValue().GetSatoshiValue(), 100000000);

  txout.SetCommitment(exp_asset, exp_value, exp_nonce, exp_surjection_proof,
                      exp_range_proof);
  EXPECT_STREQ(txout.GetWitnessHash().GetHex().c_str(),
    "51e1922fa92165e1705155a1973d9c3b78cbc253ec185f58a4d53a59b3eee093");

  EXPECT_STREQ(txout.GetAsset().GetHex().c_str(), exp_asset.GetHex().c_str());
  EXPECT_STREQ(txout.GetConfidentialValue().GetHex().c_str(),
               exp_value.GetHex().c_str());
  EXPECT_STREQ(txout.GetLockingScript().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetNonce().GetHex().c_str(), exp_nonce.GetHex().c_str());
  EXPECT_STREQ(txout.GetRangeProof().GetHex().c_str(),
               exp_range_proof.GetHex().c_str());
  EXPECT_STREQ(txout.GetSurjectionProof().GetHex().c_str(),
               exp_surjection_proof.GetHex().c_str());
  EXPECT_EQ(txout.GetValue().GetSatoshiValue(), 100000000);

  ConfidentialTxOutReference txout_ref(txout);
  EXPECT_STREQ(txout_ref.GetAsset().GetHex().c_str(),
               exp_asset.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetConfidentialValue().GetHex().c_str(),
               exp_value.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetLockingScript().GetHex().c_str(), "");
  EXPECT_STREQ(txout_ref.GetNonce().GetHex().c_str(),
               exp_nonce.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetRangeProof().GetHex().c_str(),
               exp_range_proof.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetSurjectionProof().GetHex().c_str(),
               exp_surjection_proof.GetHex().c_str());
  EXPECT_EQ(txout_ref.GetValue().GetSatoshiValue(), 100000000);
}